

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

char * __thiscall DynamicHistogram<double>::index(DynamicHistogram<double> *this,char *__s,int __c)

{
  uint uVar1;
  int iVar2;
  runtime_error *this_00;
  undefined4 extraout_var;
  undefined4 in_register_00000014;
  double in_XMM0_Qa;
  double value_local;
  DynamicHistogram<double> *this_local;
  
  uVar1 = (*this->_vptr_DynamicHistogram[2])(this,__s,CONCAT44(in_register_00000014,__c));
  if ((uVar1 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"DynamicHistogram::index - Histogram could not be initialized.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = index_(this,in_XMM0_Qa);
  return (char *)CONCAT44(extraout_var,iVar2);
}

Assistant:

int
    index(T const value)
    {
        if (!this->merge()) throw std::runtime_error("DynamicHistogram::index - Histogram could not be initialized.");
        return this->index_(value);
    }